

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_uint64
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,
          uint64_t value,semantic_tag tag,ser_context *context,error_code *ec)

{
  bool bVar1;
  target_t tVar2;
  reference pvVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_json_visitor<char> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c8;
  unsigned_long in_stack_000000d0;
  error_code *in_stack_ffffffffffffff58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__i;
  level *in_stack_ffffffffffffff60;
  string_view_type *in_stack_ffffffffffffff68;
  char cVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  
  pvVar3 = std::
           vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                   *)in_stack_ffffffffffffff60);
  bVar1 = level::is_key(pvVar3);
  if (!bVar1) {
    pvVar3 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff60);
    tVar2 = level::target(pvVar3);
    if (tVar2 != buffer) goto LAB_001a6d61;
  }
  std::__cxx11::string::clear();
  detail::from_integer<unsigned_long,std::__cxx11::string>(in_stack_000000d0,in_stack_000000c8);
LAB_001a6d61:
  pvVar3 = std::
           vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                   *)in_stack_ffffffffffffff60);
  bVar1 = level::is_key(pvVar3);
  if (bVar1) {
    pvVar3 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff60);
    tVar2 = level::target(pvVar3);
    if (tVar2 == buffer) {
      pvVar3 = std::
               vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
               ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       *)in_stack_ffffffffffffff60);
      cVar5 = (char)in_RDI;
      sVar4 = level::count(pvVar3);
      if (sVar4 != 0) {
        std::__cxx11::string::push_back(cVar5 + '8');
      }
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff60,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff58);
      std::__cxx11::string::begin();
      std::__cxx11::string::end();
      std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
      std::__cxx11::string::push_back(cVar5 + '8');
    }
    else {
      in_stack_ffffffffffffff60 = (level *)in_RDI[2]._vptr_basic_json_visitor;
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 3));
      basic_json_visitor<char>::key
                (in_RDI,in_stack_ffffffffffffff68,(ser_context *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58);
    }
  }
  else {
    pvVar3 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff60);
    tVar2 = level::target(pvVar3);
    if (tVar2 == buffer) {
      pvVar3 = std::
               vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
               ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       *)in_stack_ffffffffffffff60);
      bVar1 = level::is_object(pvVar3);
      if (!bVar1) {
        pvVar3 = std::
                 vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                 ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                         *)in_stack_ffffffffffffff60);
        sVar4 = level::count(pvVar3);
        if (sVar4 != 0) {
          std::__cxx11::string::push_back((char)in_RDI + '8');
        }
      }
      __i = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 7);
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff60,__i);
      std::__cxx11::string::begin();
      std::__cxx11::string::end();
      std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (this_00,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
    }
    else {
      basic_json_visitor<char>::uint64_value
                (in_RDI,(uint64_t)in_stack_ffffffffffffff68,
                 (semantic_tag)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                 (ser_context *)in_stack_ffffffffffffff58,(error_code *)0x1a6fa8);
    }
  }
  std::
  vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
  ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
          *)in_stack_ffffffffffffff60);
  level::advance(in_stack_ffffffffffffff60);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_uint64(uint64_t value, semantic_tag tag, const ser_context& context, std::error_code& ec) override
        {
            if (level_stack_.back().is_key() || level_stack_.back().target() == target_t::buffer)
            {
                key_.clear();
                jsoncons::detail::from_integer(value,key_);
            }

            if (level_stack_.back().is_key())
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        key_buffer_.push_back(':');
                        break;
                    default:
                        destination_->key(key_, context, ec);
                        break;
                }
            }
            else
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (!level_stack_.back().is_object() && level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        break;
                    default:
                        destination_->uint64_value(value, tag, context, ec);
                        break;
                }
            }

            level_stack_.back().advance();
            JSONCONS_VISITOR_RETURN;
        }